

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepTiledOutputFile.cpp
# Opt level: O0

void __thiscall
Imf_3_2::DeepTiledOutputFile::setFrameBuffer(DeepTiledOutputFile *this,DeepFrameBuffer *frameBuffer)

{
  PixelType PVar1;
  int iVar2;
  size_t xStride;
  size_t yStride;
  value_type pTVar3;
  bool bVar4;
  ostream *poVar5;
  char *pcVar6;
  Slice *pSVar7;
  ArgExc *pAVar8;
  Channel *pCVar9;
  TOutSliceInfo *pTVar10;
  DeepSlice *pDVar11;
  size_type sVar12;
  reference ppTVar13;
  DeepFrameBuffer *in_RSI;
  long in_RDI;
  size_t i_2;
  TOutSliceInfo *slice;
  ConstIterator j_1;
  ConstIterator i_1;
  vector<Imf_3_2::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_3_2::(anonymous_namespace)::TOutSliceInfo_*>_>
  slices;
  Slice *sampleCountSlice;
  stringstream _iex_throw_s_1;
  stringstream _iex_throw_s;
  ConstIterator j;
  ConstIterator i;
  ChannelList *channels;
  lock_guard<std::mutex> lock;
  uint in_stack_fffffffffffffa98;
  undefined4 in_stack_fffffffffffffa9c;
  uint in_stack_fffffffffffffaa0;
  undefined4 in_stack_fffffffffffffaa4;
  value_type in_stack_fffffffffffffab0;
  undefined7 in_stack_fffffffffffffb38;
  undefined1 in_stack_fffffffffffffb3f;
  const_iterator in_stack_fffffffffffffb40;
  char *in_stack_fffffffffffffba0;
  DeepFrameBuffer *in_stack_fffffffffffffba8;
  ulong local_3c0;
  stringstream local_360 [16];
  ostream local_350 [376];
  stringstream local_1d8 [16];
  ostream local_1c8 [376];
  const_iterator local_50;
  const_iterator local_48;
  const_iterator local_40;
  const_iterator local_38;
  ChannelList *local_20;
  DeepFrameBuffer *local_10;
  
  local_10 = in_RSI;
  std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)CONCAT44(in_stack_fffffffffffffaa4,in_stack_fffffffffffffaa0)
             ,(mutex_type *)CONCAT44(in_stack_fffffffffffffa9c,in_stack_fffffffffffffa98));
  local_20 = Header::channels((Header *)0x1b9280);
  local_38._M_node =
       (_Base_ptr)
       ChannelList::begin((ChannelList *)
                          CONCAT44(in_stack_fffffffffffffa9c,in_stack_fffffffffffffa98));
  do {
    local_40._M_node =
         (_Base_ptr)
         ChannelList::end((ChannelList *)
                          CONCAT44(in_stack_fffffffffffffa9c,in_stack_fffffffffffffa98));
    bVar4 = Imf_3_2::operator!=((ConstIterator *)
                                CONCAT44(in_stack_fffffffffffffaa4,in_stack_fffffffffffffaa0),
                                (ConstIterator *)
                                CONCAT44(in_stack_fffffffffffffa9c,in_stack_fffffffffffffa98));
    if (!bVar4) {
      pSVar7 = DeepFrameBuffer::getSampleCountSlice(local_10);
      if (pSVar7->base != (char *)0x0) {
        *(char **)(*(long *)(in_RDI + 8) + 0x1a0) = pSVar7->base;
        *(int *)(*(long *)(in_RDI + 8) + 0x1a8) = (int)pSVar7->xStride;
        *(int *)(*(long *)(in_RDI + 8) + 0x1ac) = (int)pSVar7->yStride;
        *(uint *)(*(long *)(in_RDI + 8) + 0x1b0) = (uint)(pSVar7->xTileCoords & 1);
        *(uint *)(*(long *)(in_RDI + 8) + 0x1b4) = (uint)(pSVar7->yTileCoords & 1);
        std::
        vector<Imf_3_2::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_3_2::(anonymous_namespace)::TOutSliceInfo_*>_>
        ::vector((vector<Imf_3_2::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_3_2::(anonymous_namespace)::TOutSliceInfo_*>_>
                  *)0x1b97ee);
        ChannelList::begin((ChannelList *)
                           CONCAT44(in_stack_fffffffffffffa9c,in_stack_fffffffffffffa98));
        while( true ) {
          ChannelList::end((ChannelList *)
                           CONCAT44(in_stack_fffffffffffffa9c,in_stack_fffffffffffffa98));
          bVar4 = Imf_3_2::operator!=((ConstIterator *)
                                      CONCAT44(in_stack_fffffffffffffaa4,in_stack_fffffffffffffaa0),
                                      (ConstIterator *)
                                      CONCAT44(in_stack_fffffffffffffa9c,in_stack_fffffffffffffa98))
          ;
          if (!bVar4) break;
          ChannelList::ConstIterator::name((ConstIterator *)0x1b9887);
          DeepFrameBuffer::find(in_stack_fffffffffffffba8,in_stack_fffffffffffffba0);
          in_stack_fffffffffffffb40._M_node =
               (_Base_ptr)
               DeepFrameBuffer::end
                         ((DeepFrameBuffer *)
                          CONCAT44(in_stack_fffffffffffffa9c,in_stack_fffffffffffffa98));
          in_stack_fffffffffffffb3f =
               Imf_3_2::operator==((ConstIterator *)
                                   CONCAT44(in_stack_fffffffffffffaa4,in_stack_fffffffffffffaa0),
                                   (ConstIterator *)
                                   CONCAT44(in_stack_fffffffffffffa9c,in_stack_fffffffffffffa98));
          if ((bool)in_stack_fffffffffffffb3f) {
            pTVar10 = (TOutSliceInfo *)operator_new(0x38);
            pCVar9 = ChannelList::ConstIterator::channel((ConstIterator *)0x1b9936);
            in_stack_fffffffffffffaa0 = 0;
            in_stack_fffffffffffffa98 = 0;
            anon_unknown_7::TOutSliceInfo::TOutSliceInfo(pTVar10,pCVar9->type,0,0,0,true,0,0);
            std::
            vector<Imf_3_2::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_3_2::(anonymous_namespace)::TOutSliceInfo_*>_>
            ::push_back((vector<Imf_3_2::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_3_2::(anonymous_namespace)::TOutSliceInfo_*>_>
                         *)CONCAT44(in_stack_fffffffffffffaa4,in_stack_fffffffffffffaa0),
                        (value_type *)CONCAT44(in_stack_fffffffffffffa9c,in_stack_fffffffffffffa98))
            ;
          }
          else {
            pTVar10 = (TOutSliceInfo *)operator_new(0x38);
            pDVar11 = DeepFrameBuffer::ConstIterator::slice((ConstIterator *)0x1b9a0b);
            PVar1 = (pDVar11->super_Slice).type;
            pDVar11 = DeepFrameBuffer::ConstIterator::slice((ConstIterator *)0x1b9a30);
            iVar2 = *(int *)&(pDVar11->super_Slice).field_0x34;
            pDVar11 = DeepFrameBuffer::ConstIterator::slice((ConstIterator *)0x1b9a52);
            xStride = (pDVar11->super_Slice).xStride;
            pDVar11 = DeepFrameBuffer::ConstIterator::slice((ConstIterator *)0x1b9a74);
            yStride = (pDVar11->super_Slice).yStride;
            pDVar11 = DeepFrameBuffer::ConstIterator::slice((ConstIterator *)0x1b9a96);
            in_stack_fffffffffffffa98 = (pDVar11->super_Slice).xTileCoords & 1;
            pDVar11 = DeepFrameBuffer::ConstIterator::slice((ConstIterator *)0x1b9aba);
            in_stack_fffffffffffffaa0 = (pDVar11->super_Slice).yTileCoords & 1;
            anon_unknown_7::TOutSliceInfo::TOutSliceInfo
                      (pTVar10,PVar1,(long)iVar2,xStride,yStride,false,in_stack_fffffffffffffa98,
                       in_stack_fffffffffffffaa0);
            std::
            vector<Imf_3_2::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_3_2::(anonymous_namespace)::TOutSliceInfo_*>_>
            ::push_back((vector<Imf_3_2::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_3_2::(anonymous_namespace)::TOutSliceInfo_*>_>
                         *)CONCAT44(in_stack_fffffffffffffaa4,in_stack_fffffffffffffaa0),
                        (value_type *)CONCAT44(in_stack_fffffffffffffa9c,in_stack_fffffffffffffa98))
            ;
            ppTVar13 = std::
                       vector<Imf_3_2::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_3_2::(anonymous_namespace)::TOutSliceInfo_*>_>
                       ::back((vector<Imf_3_2::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_3_2::(anonymous_namespace)::TOutSliceInfo_*>_>
                               *)CONCAT44(in_stack_fffffffffffffaa4,in_stack_fffffffffffffaa0));
            pTVar3 = *ppTVar13;
            pDVar11 = DeepFrameBuffer::ConstIterator::slice((ConstIterator *)0x1b9b4f);
            pTVar3->base = (pDVar11->super_Slice).base;
          }
          ChannelList::ConstIterator::operator++
                    ((ConstIterator *)CONCAT44(in_stack_fffffffffffffaa4,in_stack_fffffffffffffaa0))
          ;
        }
        DeepFrameBuffer::operator=
                  ((DeepFrameBuffer *)CONCAT44(in_stack_fffffffffffffaa4,in_stack_fffffffffffffaa0),
                   (DeepFrameBuffer *)CONCAT44(in_stack_fffffffffffffa9c,in_stack_fffffffffffffa98))
        ;
        for (local_3c0 = 0;
            sVar12 = std::
                     vector<Imf_3_2::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_3_2::(anonymous_namespace)::TOutSliceInfo_*>_>
                     ::size((vector<Imf_3_2::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_3_2::(anonymous_namespace)::TOutSliceInfo_*>_>
                             *)(*(long *)(in_RDI + 8) + 0x120)), local_3c0 < sVar12;
            local_3c0 = local_3c0 + 1) {
          ppTVar13 = std::
                     vector<Imf_3_2::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_3_2::(anonymous_namespace)::TOutSliceInfo_*>_>
                     ::operator[]((vector<Imf_3_2::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_3_2::(anonymous_namespace)::TOutSliceInfo_*>_>
                                   *)(*(long *)(in_RDI + 8) + 0x120),local_3c0);
          in_stack_fffffffffffffab0 = *ppTVar13;
          if (in_stack_fffffffffffffab0 != (value_type)0x0) {
            operator_delete(in_stack_fffffffffffffab0,0x38);
          }
        }
        std::
        vector<Imf_3_2::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_3_2::(anonymous_namespace)::TOutSliceInfo_*>_>
        ::operator=((vector<Imf_3_2::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_3_2::(anonymous_namespace)::TOutSliceInfo_*>_>
                     *)in_stack_fffffffffffffb40._M_node,
                    (vector<Imf_3_2::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_3_2::(anonymous_namespace)::TOutSliceInfo_*>_>
                     *)CONCAT17(in_stack_fffffffffffffb3f,in_stack_fffffffffffffb38));
        std::
        vector<Imf_3_2::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_3_2::(anonymous_namespace)::TOutSliceInfo_*>_>
        ::~vector((vector<Imf_3_2::(anonymous_namespace)::TOutSliceInfo_*,_std::allocator<Imf_3_2::(anonymous_namespace)::TOutSliceInfo_*>_>
                   *)in_stack_fffffffffffffab0);
        std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x1b9c9f);
        return;
      }
      pAVar8 = (ArgExc *)__cxa_allocate_exception(0x48);
      Iex_3_2::ArgExc::ArgExc
                (pAVar8,"Invalid base pointer, please set a proper sample count slice.");
      __cxa_throw(pAVar8,&Iex_3_2::ArgExc::typeinfo,Iex_3_2::ArgExc::~ArgExc);
    }
    ChannelList::ConstIterator::name((ConstIterator *)0x1b9333);
    local_48._M_node =
         (_Base_ptr)DeepFrameBuffer::find(in_stack_fffffffffffffba8,in_stack_fffffffffffffba0);
    local_50._M_node =
         (_Base_ptr)
         DeepFrameBuffer::end
                   ((DeepFrameBuffer *)CONCAT44(in_stack_fffffffffffffa9c,in_stack_fffffffffffffa98)
                   );
    bVar4 = Imf_3_2::operator==((ConstIterator *)
                                CONCAT44(in_stack_fffffffffffffaa4,in_stack_fffffffffffffaa0),
                                (ConstIterator *)
                                CONCAT44(in_stack_fffffffffffffa9c,in_stack_fffffffffffffa98));
    if (!bVar4) {
      pCVar9 = ChannelList::ConstIterator::channel((ConstIterator *)0x1b93e9);
      PVar1 = pCVar9->type;
      pDVar11 = DeepFrameBuffer::ConstIterator::slice((ConstIterator *)0x1b9411);
      if (PVar1 != (pDVar11->super_Slice).type) {
        iex_debugTrap();
        std::__cxx11::stringstream::stringstream(local_1d8);
        poVar5 = std::operator<<(local_1c8,"Pixel type of \"");
        pcVar6 = ChannelList::ConstIterator::name((ConstIterator *)0x1b9475);
        poVar5 = std::operator<<(poVar5,pcVar6);
        poVar5 = std::operator<<(poVar5,"\" channel of output file \"");
        pcVar6 = fileName((DeepTiledOutputFile *)0x1b94c9);
        poVar5 = std::operator<<(poVar5,pcVar6);
        std::operator<<(poVar5,"\" is not compatible with the frame buffer\'s pixel type.");
        pAVar8 = (ArgExc *)__cxa_allocate_exception(0x48);
        Iex_3_2::ArgExc::ArgExc(pAVar8,local_1d8);
        __cxa_throw(pAVar8,&Iex_3_2::ArgExc::typeinfo,Iex_3_2::ArgExc::~ArgExc);
      }
      pDVar11 = DeepFrameBuffer::ConstIterator::slice((ConstIterator *)0x1b95a5);
      if (((pDVar11->super_Slice).xSampling != 1) ||
         (pDVar11 = DeepFrameBuffer::ConstIterator::slice((ConstIterator *)0x1b95ca),
         (pDVar11->super_Slice).ySampling != 1)) {
        iex_debugTrap();
        std::__cxx11::stringstream::stringstream(local_360);
        std::operator<<(local_350,"All channels in a tiled file must havesampling (1,1).");
        pAVar8 = (ArgExc *)__cxa_allocate_exception(0x48);
        Iex_3_2::ArgExc::ArgExc(pAVar8,local_360);
        __cxa_throw(pAVar8,&Iex_3_2::ArgExc::typeinfo,Iex_3_2::ArgExc::~ArgExc);
      }
    }
    ChannelList::ConstIterator::operator++
              ((ConstIterator *)CONCAT44(in_stack_fffffffffffffaa4,in_stack_fffffffffffffaa0));
  } while( true );
}

Assistant:

void
DeepTiledOutputFile::setFrameBuffer (const DeepFrameBuffer& frameBuffer)
{
#if ILMTHREAD_THREADING_ENABLED
    std::lock_guard<std::mutex> lock (*_data->_streamData);
#endif
    //
    // Check if the new frame buffer descriptor
    // is compatible with the image file header.
    //

    const ChannelList& channels = _data->header.channels ();

    for (ChannelList::ConstIterator i = channels.begin (); i != channels.end ();
         ++i)
    {
        DeepFrameBuffer::ConstIterator j = frameBuffer.find (i.name ());

        if (j == frameBuffer.end ()) continue;

        if (i.channel ().type != j.slice ().type)
            THROW (
                IEX_NAMESPACE::ArgExc,
                "Pixel type of \"" << i.name ()
                                   << "\" channel "
                                      "of output file \""
                                   << fileName ()
                                   << "\" is "
                                      "not compatible with the frame buffer's "
                                      "pixel type.");

        if (j.slice ().xSampling != 1 || j.slice ().ySampling != 1)
            THROW (
                IEX_NAMESPACE::ArgExc,
                "All channels in a tiled file must have"
                "sampling (1,1).");
    }

    //
    // Store the pixel sample count table.
    //

    const Slice& sampleCountSlice = frameBuffer.getSampleCountSlice ();
    if (sampleCountSlice.base == 0)
    {
        throw IEX_NAMESPACE::ArgExc (
            "Invalid base pointer, please set a proper sample count slice.");
    }
    else
    {
        _data->sampleCountSliceBase = sampleCountSlice.base;
        _data->sampleCountXStride = static_cast<int> (sampleCountSlice.xStride);
        _data->sampleCountYStride = static_cast<int> (sampleCountSlice.yStride);
        _data->sampleCountXTileCoords = sampleCountSlice.xTileCoords;
        _data->sampleCountYTileCoords = sampleCountSlice.yTileCoords;
    }

    //
    // Initialize slice table for writePixels().
    // Pixel sample count slice is not presented in the header,
    // so it wouldn't be added here.
    // Store the pixel base pointer table.
    //

    vector<TOutSliceInfo*> slices;

    for (ChannelList::ConstIterator i = channels.begin (); i != channels.end ();
         ++i)
    {
        DeepFrameBuffer::ConstIterator j = frameBuffer.find (i.name ());

        if (j == frameBuffer.end ())
        {
            //
            // Channel i is not present in the frame buffer.
            // In the file, channel i will contain only zeroes.
            //

            slices.push_back (new TOutSliceInfo (
                i.channel ().type,
                0,      // sampleStride,
                0,      // xStride
                0,      // yStride
                true)); // zero
        }
        else
        {
            //
            // Channel i is present in the frame buffer.
            //

            slices.push_back (new TOutSliceInfo (
                j.slice ().type,
                j.slice ().sampleStride,
                j.slice ().xStride,
                j.slice ().yStride,
                false, // zero
                (j.slice ().xTileCoords) ? 1 : 0,
                (j.slice ().yTileCoords) ? 1 : 0));

            TOutSliceInfo* slice = slices.back ();
            slice->base          = j.slice ().base;
        }
    }

    //
    // Store the new frame buffer.
    //

    _data->frameBuffer = frameBuffer;

    for (size_t i = 0; i < _data->slices.size (); i++)
        delete _data->slices[i];
    _data->slices = slices;
}